

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

void __thiscall pbrt::Vector3fi::Vector3fi(Vector3fi *this,Vector3f *p,Vector3f *e)

{
  float fVar1;
  Interval<float> IVar2;
  undefined8 uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  fVar6 = (p->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar1 = (e->super_Tuple3<pbrt::Vector3,_float>).x;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar5 = fVar6 - fVar1;
    if (-INFINITY < fVar5) {
      auVar11._0_12_ = ZEXT812(0);
      auVar11._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar5),auVar11,0);
      bVar4 = (bool)((byte)uVar3 & 1);
      fVar5 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar5);
      fVar5 = (float)((int)fVar5 + -1 + (uint)(fVar5 <= 0.0) * 2);
    }
    fVar6 = fVar6 + fVar1;
    if (fVar6 < INFINITY) {
      auVar9._0_12_ = ZEXT812(0);
      auVar9._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar6),auVar9,0);
      fVar6 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar6);
      fVar6 = (float)((-(uint)(fVar6 < 0.0) | 1) + (int)fVar6);
    }
    auVar7 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar6),0x10);
  }
  else {
    auVar7._4_4_ = fVar6;
    auVar7._0_4_ = fVar6;
    auVar7._8_4_ = fVar6;
    auVar7._12_4_ = fVar6;
  }
  fVar6 = (p->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar1 = (e->super_Tuple3<pbrt::Vector3,_float>).y;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar5 = fVar6 - fVar1;
    if (-INFINITY < fVar5) {
      auVar13._0_12_ = ZEXT812(0);
      auVar13._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar5),auVar13,0);
      bVar4 = (bool)((byte)uVar3 & 1);
      fVar5 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar5);
      fVar5 = (float)((int)fVar5 + -1 + (uint)(fVar5 <= 0.0) * 2);
    }
    fVar6 = fVar6 + fVar1;
    if (fVar6 < INFINITY) {
      auVar12._0_12_ = ZEXT812(0);
      auVar12._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar6),auVar12,0);
      fVar6 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar6);
      fVar6 = (float)((-(uint)(fVar6 < 0.0) | 1) + (int)fVar6);
    }
    auVar8 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar6),0x10);
  }
  else {
    auVar8._4_4_ = fVar6;
    auVar8._0_4_ = fVar6;
    auVar8._8_4_ = fVar6;
    auVar8._12_4_ = fVar6;
  }
  fVar6 = (p->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar1 = (e->super_Tuple3<pbrt::Vector3,_float>).z;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar5 = fVar6 - fVar1;
    if (-INFINITY < fVar5) {
      auVar15._0_12_ = ZEXT812(0);
      auVar15._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar5),auVar15,0);
      bVar4 = (bool)((byte)uVar3 & 1);
      fVar5 = (float)((uint)bVar4 * -0x80000000 + (uint)!bVar4 * (int)fVar5);
      fVar5 = (float)((int)fVar5 + -1 + (uint)(fVar5 <= 0.0) * 2);
    }
    fVar6 = fVar6 + fVar1;
    if (fVar6 < INFINITY) {
      auVar14._0_12_ = ZEXT812(0);
      auVar14._12_4_ = 0;
      uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar6),auVar14,0);
      fVar6 = (float)((uint)!(bool)((byte)uVar3 & 1) * (int)fVar6);
      fVar6 = (float)((-(uint)(fVar6 < 0.0) | 1) + (int)fVar6);
    }
    auVar10 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar6),0x10);
  }
  else {
    auVar10._4_4_ = fVar6;
    auVar10._0_4_ = fVar6;
    auVar10._8_4_ = fVar6;
    auVar10._12_4_ = fVar6;
  }
  auVar11 = vmovlhps_avx(auVar7,auVar8);
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  x.low = (float)(int)auVar11._0_8_;
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  x.high = (float)(int)((ulong)auVar11._0_8_ >> 0x20);
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  y.low = (float)(int)auVar11._8_8_;
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  y.high = (float)(int)((ulong)auVar11._8_8_ >> 0x20);
  IVar2 = (Interval<float>)vmovlps_avx(auVar10);
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  z = IVar2;
  return;
}

Assistant:

PBRT_CPU_GPU
    Vector3fi(const Vector3f &p, const Vector3f &e)
        : Vector3<Interval<Float>>(Interval<Float>::FromValueAndError(p.x, e.x),
                                   Interval<Float>::FromValueAndError(p.y, e.y),
                                   Interval<Float>::FromValueAndError(p.z, e.z)) {}